

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_boundary_access<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
               (void)

{
  node_ptr plVar1;
  pointer pvVar2;
  pool<boost::default_user_allocator_malloc_free> *ppVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_220;
  undefined1 local_208 [8];
  undefined8 local_200;
  shared_count sStack_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  _Base_ptr local_1d8;
  _Base_ptr local_1d0;
  _Base_ptr local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined **local_1b0;
  undefined1 local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  pool<boost::default_user_allocator_malloc_free> *local_180;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  local_178;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
            ();
  local_180 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_180->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_180->list).ptr = (char *)0x0;
  (local_180->list).sz = 0;
  local_180->requested_size = 0x18;
  local_180->next_size = 0x20;
  local_180->start_size = 0x20;
  local_180->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
              *)&local_178,&local_220,(Column_settings *)local_180);
  if (local_220.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_220.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 1;
    uVar5 = 0;
    do {
      pvVar2 = local_220.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar6 == 6) {
        local_1c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_1b8 = "";
        local_1d0 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        local_1c8 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x255,
                   &local_1d0);
        plVar1 = local_178.reducedMatrixR_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5].column_.super_type.data_.
                 root_plus_size_.m_header.super_node.next_;
        local_208[0] = plVar1 == (node_ptr)
                                 &local_178.reducedMatrixR_.matrix_.
                                  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5].column_ ||
                       plVar1 == (node_ptr)0x0;
        local_200 = 0;
        sStack_1f8.pi_ = (sp_counted_base *)0x0;
        local_1e0 = "m.get_column(i).is_empty()";
        local_1d8 = (_Base_ptr)0x20b31a;
        local_1a8 = _S_red;
        local_1b0 = &PTR__lazy_ostream_00249168;
        local_1a0 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_198 = (_Base_ptr)&local_1e0;
        local_1f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_1e8 = "";
        boost::test_tools::tt_detail::report_assertion
                  (local_208,
                   (_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&local_1b0,&local_1f0,0x255,1,0,0);
        boost::detail::shared_count::~shared_count(&sStack_1f8);
      }
      else {
        get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
                  ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>
                    *)&local_1b0,
                   local_178.reducedMatrixR_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar5);
        test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
                  (pvVar2 + uVar5,
                   (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>
                    *)&local_1b0);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&local_1b0);
      }
      uVar5 = (ulong)uVar6;
      uVar4 = ((long)local_220.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_220.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar6 = uVar6 + 1;
    } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  ::reset(&local_178,(Column_settings *)local_180);
  ppVar3 = local_180;
  if (local_180 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_180);
  }
  operator_delete(ppVar3,0x38);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  ::~RU_matrix(&local_178);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_220);
  return;
}

Assistant:

void test_boundary_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  for (unsigned int i = 0; i < orderedBoundaries.size(); ++i) {
    if constexpr (is_RU<Matrix>()) {
      if (i == 5) {
        BOOST_CHECK(m.get_column(i).is_empty());  // reduced
      } else {
        const auto& col = m.get_column(i);  // to force the const version
        test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
      }
    } else {
      const auto& col = m.get_column(i);  // to force the const version
      test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
    }
  }
}